

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftoutln.c
# Opt level: O1

FT_Error FT_Outline_Render(FT_Library library,FT_Outline *outline,FT_Raster_Params *params)

{
  short sVar1;
  FT_Vector *pFVar2;
  long lVar3;
  long lVar4;
  FT_Error FVar5;
  long lVar6;
  FT_ListRec *pFVar7;
  FT_ListNode pFVar8;
  long lVar9;
  FT_Pos FVar10;
  FT_Renderer_conflict pFVar11;
  long lVar12;
  FT_Vector *pFVar13;
  FT_ListNode pFVar14;
  
  if (library == (FT_Library)0x0) {
    FVar5 = 0x21;
  }
  else {
    FVar5 = 0x14;
    if (outline != (FT_Outline *)0x0) {
      if (params == (FT_Raster_Params *)0x0) {
        FVar5 = 6;
      }
      else {
        sVar1 = outline->n_points;
        if ((long)sVar1 == 0) {
          lVar6 = 0;
          FVar10 = 0;
          lVar9 = 0;
          lVar12 = 0;
        }
        else {
          pFVar2 = outline->points;
          FVar10 = pFVar2->x;
          lVar6 = pFVar2->y;
          lVar9 = lVar6;
          lVar12 = FVar10;
          if (1 < sVar1) {
            pFVar13 = pFVar2 + 1;
            do {
              lVar3 = pFVar13->x;
              if (lVar3 < FVar10) {
                FVar10 = lVar3;
              }
              lVar4 = pFVar13->y;
              if (lVar12 < lVar3) {
                lVar12 = lVar3;
              }
              if (lVar4 < lVar6) {
                lVar6 = lVar4;
              }
              if (lVar9 < lVar4) {
                lVar9 = lVar4;
              }
              pFVar13 = pFVar13 + 1;
            } while (pFVar13 < pFVar2 + sVar1);
          }
        }
        if ((((-0x1000001 < FVar10) && (-0x1000001 < lVar6)) && (lVar12 < 0x1000001)) &&
           (lVar9 < 0x1000001)) {
          pFVar14 = (library->renderers).head;
          pFVar11 = library->cur_renderer;
          params->source = outline;
          if ((params->flags & 6U) == 2) {
            (params->clip_box).xMin = FVar10 >> 6;
            (params->clip_box).yMin = lVar6 >> 6;
            (params->clip_box).xMax = lVar12 + 0x3f >> 6;
            (params->clip_box).yMax = lVar9 + 0x3f >> 6;
          }
          if (pFVar11 == (FT_Renderer_conflict)0x0) {
            FVar5 = 0x13;
          }
          else {
            do {
              FVar5 = (*pFVar11->raster_render)(pFVar11->raster,params);
              if (FVar5 == 0) {
                return 0;
              }
              if ((char)FVar5 != '\x13') {
                return FVar5;
              }
              pFVar7 = (FT_ListRec *)&pFVar14->next;
              if (pFVar14 == (FT_ListNode)0x0) {
                pFVar7 = &library->renderers;
              }
              pFVar8 = pFVar7->head;
              while ((pFVar11 = (FT_Renderer_conflict)0x0, pFVar14 = (FT_ListNode)0x0,
                     pFVar8 != (FT_ListNode)0x0 &&
                     (pFVar11 = (FT_Renderer_conflict)pFVar8->data, pFVar14 = pFVar8,
                     pFVar11->glyph_format != FT_GLYPH_FORMAT_OUTLINE))) {
                pFVar8 = pFVar8->next;
              }
            } while (pFVar11 != (FT_Renderer_conflict)0x0);
          }
        }
      }
      return FVar5;
    }
  }
  return FVar5;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Outline_Render( FT_Library         library,
                     FT_Outline*        outline,
                     FT_Raster_Params*  params )
  {
    FT_Error     error;
    FT_Renderer  renderer;
    FT_ListNode  node;
    FT_BBox      cbox;


    if ( !library )
      return FT_THROW( Invalid_Library_Handle );

    if ( !outline )
      return FT_THROW( Invalid_Outline );

    if ( !params )
      return FT_THROW( Invalid_Argument );

    FT_Outline_Get_CBox( outline, &cbox );
    if ( cbox.xMin < -0x1000000L || cbox.yMin < -0x1000000L ||
         cbox.xMax >  0x1000000L || cbox.yMax >  0x1000000L )
      return FT_THROW( Invalid_Outline );

    renderer = library->cur_renderer;
    node     = library->renderers.head;

    params->source = (void*)outline;

    /* preset clip_box for direct mode */
    if ( params->flags & FT_RASTER_FLAG_DIRECT    &&
         !( params->flags & FT_RASTER_FLAG_CLIP ) )
    {
      params->clip_box.xMin = cbox.xMin >> 6;
      params->clip_box.yMin = cbox.yMin >> 6;
      params->clip_box.xMax = ( cbox.xMax + 63 ) >> 6;
      params->clip_box.yMax = ( cbox.yMax + 63 ) >> 6;
    }

    error = FT_ERR( Cannot_Render_Glyph );
    while ( renderer )
    {
      error = renderer->raster_render( renderer->raster, params );
      if ( !error || FT_ERR_NEQ( error, Cannot_Render_Glyph ) )
        break;

      /* FT_Err_Cannot_Render_Glyph is returned if the render mode   */
      /* is unsupported by the current renderer for this glyph image */
      /* format                                                      */

      /* now, look for another renderer that supports the same */
      /* format                                                */
      renderer = FT_Lookup_Renderer( library, FT_GLYPH_FORMAT_OUTLINE,
                                     &node );
    }

    return error;
  }